

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PaintedGlyphsDrawingContext.cpp
# Opt level: O0

bool __thiscall
PaintedGlyphsDrawingContext::ExecutePaintScale
          (PaintedGlyphsDrawingContext *this,FT_PaintScale inScale)

{
  bool bVar1;
  PDFUsedFont *this_00;
  double inE;
  double inF;
  FT_OpaquePaint inOpaquePaint;
  FreeTypeFaceWrapper *freeTypeFace;
  PaintedGlyphsDrawingContext *this_local;
  
  this_00 = AbstractContentContext::GetCurrentFont(this->mContentContext);
  PDFUsedFont::GetFreeTypeFont(this_00);
  inE = GetFontUnitMeasurementInPDF(this,inScale.center_x);
  inF = GetFontUnitMeasurementInPDF(this,inScale.center_y);
  inOpaquePaint._9_7_ = 0;
  inOpaquePaint.p = inScale.paint.p;
  inOpaquePaint.insert_root_transform = inScale.paint.insert_root_transform;
  bVar1 = ApplyTransformToPaint
                    (this,(double)inScale.scale_x / 65536.0,0.0,0.0,
                     (double)inScale.scale_y / 65536.0,inE,inF,inOpaquePaint);
  return bVar1;
}

Assistant:

bool PaintedGlyphsDrawingContext::ExecutePaintScale(FT_PaintScale inScale) {
    FreeTypeFaceWrapper* freeTypeFace = mContentContext->GetCurrentFont()->GetFreeTypeFont();

    return ApplyTransformToPaint(
        inScale.scale_x / scFix16Dot16Scale,
        0,
        0,
        inScale.scale_y / scFix16Dot16Scale,
        // see transform
        GetFontUnitMeasurementInPDF(inScale.center_x),
        GetFontUnitMeasurementInPDF(inScale.center_y),
        inScale.paint
    );

}